

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

int __thiscall
Js::ByteCodeBufferBuilder::GetString16Id
          (ByteCodeBufferBuilder *this,ByteBuffer *bb,bool isPropertyRecord)

{
  uint32 uVar1;
  anon_union_8_3_52f0de8f_for_ByteBuffer_1 aVar2;
  bool bVar3;
  BufferBuilder *value;
  ImmutableList<Js::BufferBuilder_*> *pIVar4;
  BufferBuilder *pBVar5;
  BufferBuilder **ppBVar6;
  undefined1 local_50 [8];
  IndexEntry indexEntry;
  ByteBuffer *local_38;
  ByteBuffer *bb_local;
  
  local_38 = bb;
  bVar3 = JsUtil::
          BaseDictionary<Js::ByteBuffer*,Js::IndexEntry,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<Js::ByteBuffer*>
                    ((BaseDictionary<Js::ByteBuffer*,Js::IndexEntry,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->string16ToId,&local_38,(IndexEntry *)local_50);
  if (!bVar3) {
    uVar1 = local_38->byteCount;
    value = (BufferBuilder *)new<Memory::ArenaAllocator>(0x20,this->alloc,0x35916e);
    aVar2 = local_38->field_1;
    value->clue = L"String16";
    value->offset = 0xffffffff;
    value->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_0137a398;
    *(uint32 *)&value->field_0x14 = uVar1;
    *(anon_union_8_3_52f0de8f_for_ByteBuffer_1 *)(value + 1) = aVar2;
    indexEntry._12_4_ = uVar1;
    pIVar4 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend
                       ((this->string16Table).list,value,this->alloc);
    (this->string16Table).list = pIVar4;
    pIVar4 = (this->string16IndexTable).list;
    if (pIVar4 == (ImmutableList<Js::BufferBuilder_*> *)0x0) {
      pBVar5 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x28,this->alloc,0x35916e);
      pBVar5->clue = L"First String16 Index";
      pBVar5->offset = 0xffffffff;
      pBVar5->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_0137a2f0;
      pBVar5[1]._vptr_BufferBuilder = (_func_int **)value;
      *(undefined4 *)&pBVar5[1].clue = 0;
      pIVar4 = regex::ImmutableList<Js::BufferBuilder_*>::OfSingle(pBVar5,this->alloc);
      (this->string16IndexTable).list = pIVar4;
      PrependByte(this,&this->string16IndexTable,L"isPropertyRecord",isPropertyRecord);
      pIVar4 = (this->string16IndexTable).list;
    }
    ppBVar6 = regex::ImmutableList<Js::BufferBuilder_*>::First(pIVar4);
    local_50 = (undefined1  [8])*ppBVar6;
    pBVar5 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x28,this->alloc,0x35916e);
    pBVar5->clue = L"String16 Index";
    pBVar5->offset = 0xffffffff;
    pBVar5->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_0137a2f0;
    pBVar5[1]._vptr_BufferBuilder = (_func_int **)value;
    *(undefined4 *)&pBVar5[1].clue = indexEntry._12_4_;
    pIVar4 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend
                       ((this->string16IndexTable).list,pBVar5,this->alloc);
    (this->string16IndexTable).list = pIVar4;
    PrependByte(this,&this->string16IndexTable,L"isPropertyRecord",'\0');
    indexEntry.isPropertyRecord._0_4_ = this->nextString16Id;
    JsUtil::
    BaseDictionary<Js::ByteBuffer*,Js::IndexEntry,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::ByteBuffer*,Js::IndexEntry,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<Js::ByteBuffer*,Js::IndexEntry,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->string16ToId,&local_38,(IndexEntry *)local_50);
    this->nextString16Id = this->nextString16Id + 1;
  }
  if (isPropertyRecord) {
    *(bool *)((long)local_50 + 0x14) = isPropertyRecord;
  }
  return (int)indexEntry.isPropertyRecord;
}

Assistant:

int GetString16Id(ByteBuffer * bb, bool isPropertyRecord = false)
    {
        IndexEntry indexEntry;
        if (!string16ToId->TryGetValue(bb, &indexEntry))
        {
            auto sizeInBytes = bb->byteCount;
            auto stringEntry = Anew(alloc, BufferBuilderRaw, _u("String16"), sizeInBytes, (const byte *)bb->pv); // Writing the terminator even though it is computable so that this memory can be used as-is when deserialized
            string16Table.list = string16Table.list->Prepend(stringEntry, alloc);
            if (string16IndexTable.list == nullptr)
            {
                // First item in the list is the first string.
                auto stringIndexEntry = Anew(alloc, BufferBuilderRelativeOffset, _u("First String16 Index"), stringEntry);
                string16IndexTable.list = regex::ImmutableList<Js::BufferBuilder*>::OfSingle(stringIndexEntry, alloc);
                PrependByte(string16IndexTable, _u("isPropertyRecord"), (BYTE)isPropertyRecord);
            }

            // Get a pointer to the previous entry of isPropertyRecord
            indexEntry.isPropertyRecord = static_cast<BufferBuilderByte*>(string16IndexTable.list->First());

            // Subsequent strings indexes point one past the end. This way, the size is always computable by subtracting indexes.
            auto stringIndexEntry = Anew(alloc, BufferBuilderRelativeOffset, _u("String16 Index"), stringEntry, sizeInBytes);
            string16IndexTable.list = string16IndexTable.list->Prepend(stringIndexEntry, alloc);

            // By default, mark the next string to be not a property record.
            PrependByte(string16IndexTable, _u("isPropertyRecord"), (BYTE)false);

            indexEntry.id = nextString16Id;
            string16ToId->Add(bb, indexEntry);
            ++nextString16Id;
        }
        // A string might start off as not being a property record and later becoming one. Hence,
        // we set only if the transition is from false => true. Once it is a property record, it cannot go back.
        if(isPropertyRecord)
        {
            indexEntry.isPropertyRecord->value = isPropertyRecord;
        }
        return indexEntry.id;
    }